

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsNotification.h
# Opt level: O0

void __thiscall
Notification::Notification
          (Notification *this,PAdsNotificationFuncEx __func,uint32_t __hUser,uint32_t length,
          AmsAddr __amsAddr,uint16_t __port)

{
  ulong uVar1;
  uchar *puVar2;
  AdsNotificationHeader *header;
  allocator<unsigned_char> local_2b;
  uint16_t local_2a;
  uint local_28;
  uint32_t uStack_24;
  uint16_t __port_local;
  uint32_t length_local;
  uint32_t __hUser_local;
  PAdsNotificationFuncEx __func_local;
  Notification *this_local;
  AmsAddr __amsAddr_local;
  
  local_2a = __port;
  local_28 = length;
  uStack_24 = __hUser;
  _length_local = __func;
  __func_local = (PAdsNotificationFuncEx)this;
  this_local = (Notification *)__amsAddr;
  std::pair<unsigned_short,_AmsAddr>::pair<unsigned_short_&,_AmsAddr_&,_true>
            (&this->connection,&local_2a,(AmsAddr *)&this_local);
  this->callback = _length_local;
  uVar1 = (ulong)local_28;
  std::allocator<unsigned_char>::allocator(&local_2b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buffer,uVar1 + 0x10,&local_2b);
  std::allocator<unsigned_char>::~allocator(&local_2b);
  this->hUser = uStack_24;
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->buffer);
  puVar2[8] = '\0';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  *(uint *)(puVar2 + 0xc) = local_28;
  return;
}

Assistant:

Notification(PAdsNotificationFuncEx __func,
                 uint32_t               __hUser,
                 uint32_t               length,
                 AmsAddr                __amsAddr,
                 uint16_t               __port)
        : connection({__port, __amsAddr}),
        callback(__func),
        buffer(sizeof(AdsNotificationHeader) + length),
        hUser(__hUser)
    {
        auto header = reinterpret_cast<AdsNotificationHeader*>(buffer.data());
        header->hNotification = 0;
        header->cbSampleSize = length;
    }